

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrossSite.cpp
# Opt level: O0

BOOL Js::CrossSite::NeedMarshalVar(Var instance,ScriptContext *requestContext)

{
  bool bVar1;
  TypeId typeId;
  int iVar2;
  BOOL BVar3;
  RecyclableObject *this;
  ScriptContext *pSVar4;
  DynamicObject *pDVar5;
  byte local_31;
  RecyclableObject *object;
  ScriptContext *requestContext_local;
  Var instance_local;
  
  bVar1 = TaggedNumber::Is(instance);
  if (bVar1) {
    instance_local._4_4_ = 0;
  }
  else {
    this = UnsafeVarTo<Js::RecyclableObject>(instance);
    pSVar4 = RecyclableObject::GetScriptContext(this);
    if (pSVar4 == requestContext) {
      instance_local._4_4_ = 0;
    }
    else {
      bVar1 = Phases::IsEnabled((Phases *)&DAT_01ec1678,MarshalPhase);
      if (bVar1) {
        pSVar4 = RecyclableObject::GetScriptContext(this);
        Output::Print(L"NeedMarshalVar: %p (var sc: %p, request sc: %p)\n",instance,pSVar4,
                      requestContext);
      }
      typeId = RecyclableObject::GetTypeId(this);
      bVar1 = DynamicType::Is(typeId);
      if (bVar1) {
        pDVar5 = UnsafeVarTo<Js::DynamicObject,Js::RecyclableObject>(this);
        iVar2 = (*(pDVar5->super_RecyclableObject).super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x66])();
        local_31 = 0;
        if (iVar2 == 0) {
          BVar3 = RecyclableObject::IsExternal(this);
          local_31 = BVar3 != 0 ^ 0xff;
        }
        instance_local._4_4_ = (uint)(local_31 & 1);
      }
      else {
        instance_local._4_4_ = 1;
      }
    }
  }
  return instance_local._4_4_;
}

Assistant:

BOOL CrossSite::NeedMarshalVar(Var instance, ScriptContext * requestContext)
    {
        if (TaggedNumber::Is(instance))
        {
            return FALSE;
        }
        RecyclableObject * object = UnsafeVarTo<RecyclableObject>(instance);
        if (object->GetScriptContext() == requestContext)
        {
            return FALSE;
        }
        if (PHASE_TRACE1(Js::Phase::MarshalPhase))
        {
            Output::Print(_u("NeedMarshalVar: %p (var sc: %p, request sc: %p)\n"), instance, object->GetScriptContext(), requestContext);
        }
        if (DynamicType::Is(object->GetTypeId()))
        {
            return !UnsafeVarTo<DynamicObject>(object)->IsCrossSiteObject() && !object->IsExternal();
        }
        return TRUE;
    }